

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBaseRunner.cpp
# Opt level: O0

int __thiscall xmrig::CudaBaseRunner::init(CudaBaseRunner *this,EVP_PKEY_CTX *ctx)

{
  uint32_t id;
  uint uVar1;
  char *pcVar2;
  nvid_ctx *pnVar3;
  undefined7 extraout_var;
  ulong uVar4;
  int32_t bfactor;
  int in_EDX;
  int32_t in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  undefined1 result;
  CudaBaseRunner *this_00;
  bool local_1;
  
  pcVar2 = CudaThread::index(&this->m_data->thread,(char *)ctx,in_EDX);
  bfactor = (int32_t)pcVar2;
  id = CudaThread::bfactor(&this->m_data->thread);
  CudaThread::bsleep(&this->m_data->thread);
  pnVar3 = CudaLib::alloc(id,bfactor,in_stack_ffffffffffffffcc);
  this->m_ctx = pnVar3;
  this_00 = (CudaBaseRunner *)this->m_ctx;
  CudaThread::blocks(&this->m_data->thread);
  CudaThread::threads(&this->m_data->thread);
  result = (undefined1)((ulong)this >> 0x38);
  uVar1 = CudaLib::deviceInfo((nvid_ctx *)CONCAT44(id,bfactor),in_stack_ffffffffffffffcc,
                              in_stack_ffffffffffffffc8);
  uVar4 = (ulong)uVar1;
  if (uVar1 == 0) {
    CudaLib::deviceInit((nvid_ctx *)CONCAT44(id,bfactor));
    local_1 = callWrapper(this_00,(bool)result);
    uVar4 = CONCAT71(extraout_var,local_1);
  }
  else {
    local_1 = false;
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),local_1);
}

Assistant:

bool xmrig::CudaBaseRunner::init()
{
    m_ctx = CudaLib::alloc(m_data.thread.index(), m_data.thread.bfactor(), m_data.thread.bsleep());
    if (CudaLib::deviceInfo(m_ctx, m_data.thread.blocks(), m_data.thread.threads())) {
        return false;
    }

    return callWrapper(CudaLib::deviceInit(m_ctx));
}